

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

void lanli_unescape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  long lVar1;
  byte bVar2;
  html_entity *phVar3;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  uint8_t *str;
  uint c;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar9 = 0;
  do {
    bVar10 = uVar9 < size;
    sVar6 = uVar9;
    if ((bVar10) && (uVar5 = uVar9, data[uVar9] != '&')) {
      do {
        uVar5 = uVar5 + 1;
        sVar6 = size;
        if (size == uVar5) break;
        sVar6 = uVar5;
      } while (data[uVar5] != '&');
      bVar10 = uVar5 < size;
    }
    if (!(bool)(uVar9 != 0 | bVar10)) {
      lanli_buffer_put(ob,data,size);
      return;
    }
    if (uVar9 <= sVar6 && sVar6 - uVar9 != 0) {
      lanli_buffer_put(ob,data + uVar9,sVar6 - uVar9);
    }
    if (!bVar10) {
      return;
    }
    str = data + sVar6 + 1;
    uVar5 = size - (sVar6 + 1);
    if ((uVar5 < 4) || (*str != '#')) {
      uVar7 = 0x1f;
      if (uVar5 < 0x1f) {
        uVar7 = uVar5;
      }
      if (2 < uVar5) {
        uVar9 = 2;
        do {
          if (data[uVar9 + sVar6 + 1] == ' ') break;
          if (data[uVar9 + sVar6 + 1] == ';') {
            phVar3 = find_entity((char *)str,(uint)uVar9);
            if (phVar3 != (html_entity *)0x0) {
              lanli_buffer_put(ob,phVar3->utf8,phVar3->size);
              uVar9 = uVar9 + 1;
              goto LAB_001242a1;
            }
            break;
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
LAB_00124291:
      lanli_buffer_putc(ob,'&');
      uVar9 = 0;
    }
    else {
      if ((byte)(data[sVar6 + 2] - 0x30) < 10) {
        uVar7 = 1;
        c = 0;
        do {
          uVar9 = uVar7;
          if (9 < (byte)(data[uVar7 + sVar6 + 1] - 0x30)) break;
          c = ((uint)data[uVar7 + sVar6 + 1] + c * 10) - 0x30;
          lVar1 = (2 - size) + sVar6 + uVar7;
          uVar7 = uVar7 + 1;
          uVar9 = uVar5;
        } while (lVar1 != 0);
LAB_00124266:
        bVar10 = true;
        if ((uVar9 < uVar5) && (str[uVar9] == ';')) {
          lanli_buffer_put_utf8(ob,c);
          uVar9 = uVar9 + 1;
          bVar10 = false;
        }
      }
      else {
        if ((data[sVar6 + 2] | 0x20) != 0x78) {
          c = 0;
          uVar9 = 0;
          goto LAB_00124266;
        }
        uVar7 = 3;
        if (3 < uVar5) {
          uVar7 = uVar5;
        }
        uVar8 = 2;
        c = 0;
        do {
          bVar2 = data[uVar8 + sVar6 + 1];
          pvVar4 = memchr("0123456789ABCDEFabcdef",(uint)bVar2,0x17);
          uVar9 = uVar8;
          if (pvVar4 == (void *)0x0) break;
          c = (c * 0x10 + (bVar2 | 0x20) % 0x27) - 9;
          uVar8 = uVar8 + 1;
          uVar9 = uVar7;
        } while (uVar7 != uVar8);
        if (uVar9 != 2) goto LAB_00124266;
        bVar10 = false;
        uVar9 = 0;
      }
      if (bVar10) goto LAB_00124291;
    }
LAB_001242a1:
    uVar9 = uVar9 + sVar6 + 1;
  } while( true );
}

Assistant:

void lanli_unescape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && data[i] != '&') i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    i++;
    i += unescape_entity(ob, data + i, size - i);
  }
}